

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void av1_read_color_config
               (aom_read_bit_buffer *rb,int allow_lowbitdepth,SequenceHeader *seq_params,
               aom_internal_error_info *error_info)

{
  uint8_t uVar1;
  int iVar2;
  aom_bit_depth_t aVar3;
  int iVar4;
  aom_color_primaries_t aVar5;
  aom_transfer_characteristics_t aVar6;
  aom_matrix_coefficients_t aVar7;
  aom_chroma_sample_position_t aVar8;
  
  iVar2 = aom_rb_read_bit(rb);
  if (iVar2 == 0 || seq_params->profile != '\x02') {
    if ('\x02' < seq_params->profile) {
      aom_internal_error(error_info,AOM_CODEC_UNSUP_BITSTREAM,
                         "Unsupported profile/bit-depth combination");
      goto LAB_00169f36;
    }
    aVar3 = (uint)(iVar2 != 0) * 2 + AOM_BITS_8;
  }
  else {
    iVar2 = aom_rb_read_bit(rb);
    aVar3 = (uint)(iVar2 != 0) * 2 + AOM_BITS_10;
  }
  seq_params->bit_depth = aVar3;
LAB_00169f36:
  seq_params->use_highbitdepth = allow_lowbitdepth == 0 || AOM_BITS_8 < seq_params->bit_depth;
  iVar2 = 0;
  if (seq_params->profile != '\x01') {
    iVar2 = aom_rb_read_bit(rb);
  }
  seq_params->monochrome = (uint8_t)iVar2;
  iVar4 = aom_rb_read_bit(rb);
  if (iVar4 == 0) {
    seq_params->color_primaries = AOM_CICP_CP_UNSPECIFIED;
    seq_params->transfer_characteristics = AOM_CICP_TC_UNSPECIFIED;
    aVar7 = AOM_CICP_MC_UNSPECIFIED;
  }
  else {
    aVar5 = aom_rb_read_literal(rb,8);
    seq_params->color_primaries = aVar5;
    aVar6 = aom_rb_read_literal(rb,8);
    seq_params->transfer_characteristics = aVar6;
    aVar7 = aom_rb_read_literal(rb,8);
  }
  seq_params->matrix_coefficients = aVar7;
  if (iVar2 == 0) {
    if (((seq_params->color_primaries == AOM_CICP_CP_BT_709) &&
        (seq_params->transfer_characteristics == AOM_CICP_TC_SRGB)) &&
       (seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY)) {
      seq_params->subsampling_y = 0;
      seq_params->color_range = 1;
      seq_params->subsampling_x = 0;
      if ((seq_params->profile != '\x01') &&
         ((seq_params->profile != '\x02' || (seq_params->bit_depth != AOM_BITS_12)))) {
        aom_internal_error(error_info,AOM_CODEC_UNSUP_BITSTREAM,
                           "sRGB colorspace not compatible with specified profile");
      }
    }
    else {
      iVar2 = aom_rb_read_bit(rb);
      seq_params->color_range = iVar2;
      if (seq_params->profile == '\x01') {
        seq_params->subsampling_x = 0;
        seq_params->subsampling_y = 0;
      }
      else if (seq_params->profile == '\0') {
        seq_params->subsampling_x = 1;
        seq_params->subsampling_y = 1;
      }
      else if (seq_params->bit_depth == AOM_BITS_12) {
        iVar2 = aom_rb_read_bit(rb);
        seq_params->subsampling_x = iVar2;
        if (iVar2 == 0) {
          seq_params->subsampling_y = 0;
        }
        else {
          iVar2 = aom_rb_read_bit(rb);
          seq_params->subsampling_y = iVar2;
        }
      }
      else {
        seq_params->subsampling_x = 1;
        seq_params->subsampling_y = 0;
      }
      if ((seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY) &&
         ((seq_params->subsampling_x != 0 || (seq_params->subsampling_y != 0)))) {
        aom_internal_error(error_info,AOM_CODEC_UNSUP_BITSTREAM,
                           "Identity CICP Matrix incompatible with non 4:4:4 color sampling");
      }
      if ((seq_params->subsampling_x != 0) && (seq_params->subsampling_y != 0)) {
        aVar8 = aom_rb_read_literal(rb,2);
        seq_params->chroma_sample_position = aVar8;
      }
    }
    iVar2 = aom_rb_read_bit(rb);
    uVar1 = (uint8_t)iVar2;
  }
  else {
    iVar2 = aom_rb_read_bit(rb);
    seq_params->color_range = iVar2;
    seq_params->subsampling_x = 1;
    seq_params->subsampling_y = 1;
    seq_params->chroma_sample_position = AOM_CSP_UNKNOWN;
    uVar1 = '\0';
  }
  seq_params->separate_uv_delta_q = uVar1;
  return;
}

Assistant:

void av1_read_color_config(struct aom_read_bit_buffer *rb,
                           int allow_lowbitdepth, SequenceHeader *seq_params,
                           struct aom_internal_error_info *error_info) {
  read_bitdepth(rb, seq_params, error_info);

  seq_params->use_highbitdepth =
      seq_params->bit_depth > AOM_BITS_8 || !allow_lowbitdepth;
  // monochrome bit (not needed for PROFILE_1)
  const int is_monochrome =
      seq_params->profile != PROFILE_1 ? aom_rb_read_bit(rb) : 0;
  seq_params->monochrome = is_monochrome;
  int color_description_present_flag = aom_rb_read_bit(rb);
  if (color_description_present_flag) {
    seq_params->color_primaries = aom_rb_read_literal(rb, 8);
    seq_params->transfer_characteristics = aom_rb_read_literal(rb, 8);
    seq_params->matrix_coefficients = aom_rb_read_literal(rb, 8);
  } else {
    seq_params->color_primaries = AOM_CICP_CP_UNSPECIFIED;
    seq_params->transfer_characteristics = AOM_CICP_TC_UNSPECIFIED;
    seq_params->matrix_coefficients = AOM_CICP_MC_UNSPECIFIED;
  }
  if (is_monochrome) {
    // [16,235] (including xvycc) vs [0,255] range
    seq_params->color_range = aom_rb_read_bit(rb);
    seq_params->subsampling_y = seq_params->subsampling_x = 1;
    seq_params->chroma_sample_position = AOM_CSP_UNKNOWN;
    seq_params->separate_uv_delta_q = 0;
    return;
  }
  if (seq_params->color_primaries == AOM_CICP_CP_BT_709 &&
      seq_params->transfer_characteristics == AOM_CICP_TC_SRGB &&
      seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY) {
    seq_params->subsampling_y = seq_params->subsampling_x = 0;
    seq_params->color_range = 1;  // assume full color-range
    if (!(seq_params->profile == PROFILE_1 ||
          (seq_params->profile == PROFILE_2 &&
           seq_params->bit_depth == AOM_BITS_12))) {
      aom_internal_error(
          error_info, AOM_CODEC_UNSUP_BITSTREAM,
          "sRGB colorspace not compatible with specified profile");
    }
  } else {
    // [16,235] (including xvycc) vs [0,255] range
    seq_params->color_range = aom_rb_read_bit(rb);
    if (seq_params->profile == PROFILE_0) {
      // 420 only
      seq_params->subsampling_x = seq_params->subsampling_y = 1;
    } else if (seq_params->profile == PROFILE_1) {
      // 444 only
      seq_params->subsampling_x = seq_params->subsampling_y = 0;
    } else {
      assert(seq_params->profile == PROFILE_2);
      if (seq_params->bit_depth == AOM_BITS_12) {
        seq_params->subsampling_x = aom_rb_read_bit(rb);
        if (seq_params->subsampling_x)
          seq_params->subsampling_y = aom_rb_read_bit(rb);  // 422 or 420
        else
          seq_params->subsampling_y = 0;  // 444
      } else {
        // 422
        seq_params->subsampling_x = 1;
        seq_params->subsampling_y = 0;
      }
    }
    if (seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY &&
        (seq_params->subsampling_x || seq_params->subsampling_y)) {
      aom_internal_error(
          error_info, AOM_CODEC_UNSUP_BITSTREAM,
          "Identity CICP Matrix incompatible with non 4:4:4 color sampling");
    }
    if (seq_params->subsampling_x && seq_params->subsampling_y) {
      seq_params->chroma_sample_position = aom_rb_read_literal(rb, 2);
    }
  }
  seq_params->separate_uv_delta_q = aom_rb_read_bit(rb);
}